

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  int32_t iVar2;
  int iVar3;
  DataKey *pDVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  SPxId enterCoId;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_538;
  DataKey local_530;
  cpp_dec_float<100U,_int,_void> local_528;
  cpp_dec_float<100U,_int,_void> local_4d8;
  cpp_dec_float<100U,_int,_void> local_488;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  local_530.info = 0;
  local_530.idx = -1;
  local_538.info = 0;
  local_538.idx = -1;
  local_4d8.fpclass = cpp_dec_float_finite;
  local_4d8.prec_elem = 0x10;
  local_4d8.data._M_elems[0] = 0;
  local_4d8.data._M_elems[1] = 0;
  local_4d8.data._M_elems[2] = 0;
  local_4d8.data._M_elems[3] = 0;
  local_4d8.data._M_elems[4] = 0;
  local_4d8.data._M_elems[5] = 0;
  local_4d8.data._M_elems[6] = 0;
  local_4d8.data._M_elems[7] = 0;
  local_4d8.data._M_elems[8] = 0;
  local_4d8.data._M_elems[9] = 0;
  local_4d8.data._M_elems[10] = 0;
  local_4d8.data._M_elems[0xb] = 0;
  local_4d8.data._M_elems[0xc] = 0;
  local_4d8.data._M_elems[0xd] = 0;
  local_4d8.data._M_elems._56_5_ = 0;
  local_4d8.data._M_elems[0xf]._1_3_ = 0;
  local_4d8.exp = 0;
  local_4d8.neg = false;
  local_528.fpclass = cpp_dec_float_finite;
  local_528.prec_elem = 0x10;
  local_528.data._M_elems[0] = 0;
  local_528.data._M_elems[1] = 0;
  local_528.data._M_elems[2] = 0;
  local_528.data._M_elems[3] = 0;
  local_528.data._M_elems[4] = 0;
  local_528.data._M_elems[5] = 0;
  local_528.data._M_elems[6] = 0;
  local_528.data._M_elems[7] = 0;
  local_528.data._M_elems[8] = 0;
  local_528.data._M_elems[9] = 0;
  local_528.data._M_elems[10] = 0;
  local_528.data._M_elems[0xb] = 0;
  local_528.data._M_elems[0xc] = 0;
  local_528.data._M_elems[0xd] = 0;
  local_528.data._M_elems._56_5_ = 0;
  local_528.data._M_elems[0xf]._1_3_ = 0;
  local_528.exp = 0;
  local_528.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_4d8,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_528,0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&this->last,1.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&this->last,1.0);
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) {
        uVar6 = (tol->m_backend).data._M_elems[0];
        uVar7 = (tol->m_backend).data._M_elems[1];
        uVar8 = (tol->m_backend).data._M_elems[2];
        uVar9 = (tol->m_backend).data._M_elems[3];
        uVar10 = (tol->m_backend).data._M_elems[4];
        uVar11 = (tol->m_backend).data._M_elems[5];
        uVar12 = (tol->m_backend).data._M_elems[6];
        uVar13 = (tol->m_backend).data._M_elems[7];
        uVar14 = (tol->m_backend).data._M_elems[8];
        uVar15 = (tol->m_backend).data._M_elems[9];
        uVar16 = (tol->m_backend).data._M_elems[10];
        uVar17 = (tol->m_backend).data._M_elems[0xb];
        uVar18 = (tol->m_backend).data._M_elems[0xc];
        uVar19 = (tol->m_backend).data._M_elems[0xd];
        uVar20 = (tol->m_backend).data._M_elems[0xe];
        uVar21 = (tol->m_backend).data._M_elems[0xf];
        pnVar5 = &local_118;
        goto LAB_00469c16;
      }
      local_c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 10)
      ;
      local_c8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_c8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_c8.m_backend.exp = (tol->m_backend).exp;
      local_c8.m_backend.neg = (tol->m_backend).neg;
      local_c8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_c8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_538 = (DataKey)buildBestPriceVectorEnterDim
                                     (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_4d8,&local_c8);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_168.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 10);
      local_168.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_168.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_168.m_backend.exp = (tol->m_backend).exp;
      local_168.m_backend.neg = (tol->m_backend).neg;
      local_168.m_backend.fpclass = (tol->m_backend).fpclass;
      local_168.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_538 = (DataKey)selectEnterHyperDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_4d8,&local_168);
    }
    else {
      uVar6 = (tol->m_backend).data._M_elems[0];
      uVar7 = (tol->m_backend).data._M_elems[1];
      uVar8 = (tol->m_backend).data._M_elems[2];
      uVar9 = (tol->m_backend).data._M_elems[3];
      uVar10 = (tol->m_backend).data._M_elems[4];
      uVar11 = (tol->m_backend).data._M_elems[5];
      uVar12 = (tol->m_backend).data._M_elems[6];
      uVar13 = (tol->m_backend).data._M_elems[7];
      uVar14 = (tol->m_backend).data._M_elems[8];
      uVar15 = (tol->m_backend).data._M_elems[9];
      uVar16 = (tol->m_backend).data._M_elems[10];
      uVar17 = (tol->m_backend).data._M_elems[0xb];
      uVar18 = (tol->m_backend).data._M_elems[0xc];
      uVar19 = (tol->m_backend).data._M_elems[0xd];
      uVar20 = (tol->m_backend).data._M_elems[0xe];
      uVar21 = (tol->m_backend).data._M_elems[0xf];
      pnVar5 = &local_1b8;
LAB_00469c16:
      (pnVar5->m_backend).data._M_elems[0xc] = uVar18;
      (pnVar5->m_backend).data._M_elems[0xd] = uVar19;
      (pnVar5->m_backend).data._M_elems[0xe] = uVar20;
      (pnVar5->m_backend).data._M_elems[0xf] = uVar21;
      (pnVar5->m_backend).data._M_elems[8] = uVar14;
      (pnVar5->m_backend).data._M_elems[9] = uVar15;
      (pnVar5->m_backend).data._M_elems[10] = uVar16;
      (pnVar5->m_backend).data._M_elems[0xb] = uVar17;
      (pnVar5->m_backend).data._M_elems[4] = uVar10;
      (pnVar5->m_backend).data._M_elems[5] = uVar11;
      (pnVar5->m_backend).data._M_elems[6] = uVar12;
      (pnVar5->m_backend).data._M_elems[7] = uVar13;
      (pnVar5->m_backend).data._M_elems[0] = uVar6;
      (pnVar5->m_backend).data._M_elems[1] = uVar7;
      (pnVar5->m_backend).data._M_elems[2] = uVar8;
      (pnVar5->m_backend).data._M_elems[3] = uVar9;
      (pnVar5->m_backend).exp = (tol->m_backend).exp;
      (pnVar5->m_backend).neg = (tol->m_backend).neg;
      iVar2 = (tol->m_backend).prec_elem;
      (pnVar5->m_backend).fpclass = (tol->m_backend).fpclass;
      (pnVar5->m_backend).prec_elem = iVar2;
      local_538 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_4d8,pnVar5,0,1);
    }
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       (pSVar1 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver,
       (pSVar1->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).updateCount == 0)) {
      if (((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver)->sparsePricingEnterCo != true) {
        uVar6 = (tol->m_backend).data._M_elems[0];
        uVar7 = (tol->m_backend).data._M_elems[1];
        uVar8 = (tol->m_backend).data._M_elems[2];
        uVar9 = (tol->m_backend).data._M_elems[3];
        uVar10 = (tol->m_backend).data._M_elems[4];
        uVar11 = (tol->m_backend).data._M_elems[5];
        uVar12 = (tol->m_backend).data._M_elems[6];
        uVar13 = (tol->m_backend).data._M_elems[7];
        uVar14 = (tol->m_backend).data._M_elems[8];
        uVar15 = (tol->m_backend).data._M_elems[9];
        uVar16 = (tol->m_backend).data._M_elems[10];
        uVar17 = (tol->m_backend).data._M_elems[0xb];
        uVar18 = (tol->m_backend).data._M_elems[0xc];
        uVar19 = (tol->m_backend).data._M_elems[0xd];
        uVar20 = (tol->m_backend).data._M_elems[0xe];
        uVar21 = (tol->m_backend).data._M_elems[0xf];
        pnVar5 = &local_258;
        goto LAB_00469af5;
      }
      local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_208.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_208.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_208.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_208.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 10);
      local_208.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_208.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_208.m_backend.exp = (tol->m_backend).exp;
      local_208.m_backend.neg = (tol->m_backend).neg;
      local_208.m_backend.fpclass = (tol->m_backend).fpclass;
      local_208.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_530 = (DataKey)buildBestPriceVectorEnterCoDim
                                     (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_528,&local_208);
    }
    else if (pSVar1->sparsePricingEnterCo == true) {
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_2a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_2a8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 10);
      local_2a8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_2a8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_2a8.m_backend.exp = (tol->m_backend).exp;
      local_2a8.m_backend.neg = (tol->m_backend).neg;
      local_2a8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_2a8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_530 = (DataKey)selectEnterHyperCoDim
                                     (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_528,&local_2a8);
    }
    else {
      uVar6 = (tol->m_backend).data._M_elems[0];
      uVar7 = (tol->m_backend).data._M_elems[1];
      uVar8 = (tol->m_backend).data._M_elems[2];
      uVar9 = (tol->m_backend).data._M_elems[3];
      uVar10 = (tol->m_backend).data._M_elems[4];
      uVar11 = (tol->m_backend).data._M_elems[5];
      uVar12 = (tol->m_backend).data._M_elems[6];
      uVar13 = (tol->m_backend).data._M_elems[7];
      uVar14 = (tol->m_backend).data._M_elems[8];
      uVar15 = (tol->m_backend).data._M_elems[9];
      uVar16 = (tol->m_backend).data._M_elems[10];
      uVar17 = (tol->m_backend).data._M_elems[0xb];
      uVar18 = (tol->m_backend).data._M_elems[0xc];
      uVar19 = (tol->m_backend).data._M_elems[0xd];
      uVar20 = (tol->m_backend).data._M_elems[0xe];
      uVar21 = (tol->m_backend).data._M_elems[0xf];
      pnVar5 = &local_2f8;
LAB_00469af5:
      (pnVar5->m_backend).data._M_elems[0xc] = uVar18;
      (pnVar5->m_backend).data._M_elems[0xd] = uVar19;
      (pnVar5->m_backend).data._M_elems[0xe] = uVar20;
      (pnVar5->m_backend).data._M_elems[0xf] = uVar21;
      (pnVar5->m_backend).data._M_elems[8] = uVar14;
      (pnVar5->m_backend).data._M_elems[9] = uVar15;
      (pnVar5->m_backend).data._M_elems[10] = uVar16;
      (pnVar5->m_backend).data._M_elems[0xb] = uVar17;
      (pnVar5->m_backend).data._M_elems[4] = uVar10;
      (pnVar5->m_backend).data._M_elems[5] = uVar11;
      (pnVar5->m_backend).data._M_elems[6] = uVar12;
      (pnVar5->m_backend).data._M_elems[7] = uVar13;
      (pnVar5->m_backend).data._M_elems[0] = uVar6;
      (pnVar5->m_backend).data._M_elems[1] = uVar7;
      (pnVar5->m_backend).data._M_elems[2] = uVar8;
      (pnVar5->m_backend).data._M_elems[3] = uVar9;
      (pnVar5->m_backend).exp = (tol->m_backend).exp;
      (pnVar5->m_backend).neg = (tol->m_backend).neg;
      iVar2 = (tol->m_backend).prec_elem;
      (pnVar5->m_backend).fpclass = (tol->m_backend).fpclass;
      (pnVar5->m_backend).prec_elem = iVar2;
      local_530 = (DataKey)selectEnterDenseCoDim
                                     (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_528,pnVar5,0,1);
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      local_348.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_348.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_348.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_348.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_348.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_348.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 10);
      local_348.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_348.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_348.m_backend.exp = (tol->m_backend).exp;
      local_348.m_backend.neg = (tol->m_backend).neg;
      local_348.m_backend.fpclass = (tol->m_backend).fpclass;
      local_348.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_538 = (DataKey)selectEnterSparseDim
                                     (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_4d8,&local_348);
    }
    else {
      local_398.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_398.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_398.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_398.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_398.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_398.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 10);
      local_398.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xc);
      local_398.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((tol->m_backend).data._M_elems + 0xe);
      local_398.m_backend.exp = (tol->m_backend).exp;
      local_398.m_backend.neg = (tol->m_backend).neg;
      local_398.m_backend.fpclass = (tol->m_backend).fpclass;
      local_398.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_538 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_4d8,&local_398,0,1);
    }
    if ((((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->sparsePricingEnterCo != true) || (this->refined != false)) {
      uVar6 = (tol->m_backend).data._M_elems[0];
      uVar7 = (tol->m_backend).data._M_elems[1];
      uVar8 = (tol->m_backend).data._M_elems[2];
      uVar9 = (tol->m_backend).data._M_elems[3];
      uVar10 = (tol->m_backend).data._M_elems[4];
      uVar11 = (tol->m_backend).data._M_elems[5];
      uVar12 = (tol->m_backend).data._M_elems[6];
      uVar13 = (tol->m_backend).data._M_elems[7];
      uVar14 = (tol->m_backend).data._M_elems[8];
      uVar15 = (tol->m_backend).data._M_elems[9];
      uVar16 = (tol->m_backend).data._M_elems[10];
      uVar17 = (tol->m_backend).data._M_elems[0xb];
      uVar18 = (tol->m_backend).data._M_elems[0xc];
      uVar19 = (tol->m_backend).data._M_elems[0xd];
      uVar20 = (tol->m_backend).data._M_elems[0xe];
      uVar21 = (tol->m_backend).data._M_elems[0xf];
      pnVar5 = &local_438;
      goto LAB_00469af5;
    }
    local_3e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    local_3e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    local_3e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    local_3e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    local_3e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    local_3e8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 10);
    local_3e8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 0xc)
    ;
    local_3e8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 0xe)
    ;
    local_3e8.m_backend.exp = (tol->m_backend).exp;
    local_3e8.m_backend.neg = (tol->m_backend).neg;
    local_3e8.m_backend.fpclass = (tol->m_backend).fpclass;
    local_3e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
    local_530 = (DataKey)selectEnterSparseCoDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_528,&local_3e8);
  }
  if (local_538.info != 0) {
    local_488.fpclass = cpp_dec_float_finite;
    local_488.prec_elem = 0x10;
    local_488.data._M_elems[0] = 0;
    local_488.data._M_elems[1] = 0;
    local_488.data._M_elems[2] = 0;
    local_488.data._M_elems[3] = 0;
    local_488.data._M_elems[4] = 0;
    local_488.data._M_elems[5] = 0;
    local_488.data._M_elems[6] = 0;
    local_488.data._M_elems[7] = 0;
    local_488.data._M_elems[8] = 0;
    local_488.data._M_elems[9] = 0;
    local_488.data._M_elems[10] = 0;
    local_488.data._M_elems[0xb] = 0;
    local_488.data._M_elems[0xc] = 0;
    local_488.data._M_elems[0xd] = 0;
    local_488.data._M_elems._56_5_ = 0;
    local_488.data._M_elems[0xf]._1_3_ = 0;
    local_488.exp = 0;
    local_488.neg = false;
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_78,0.8);
    local_488.data._M_elems[0] = local_528.data._M_elems[0];
    local_488.data._M_elems[1] = local_528.data._M_elems[1];
    local_488.data._M_elems[2] = local_528.data._M_elems[2];
    local_488.data._M_elems[3] = local_528.data._M_elems[3];
    local_488.data._M_elems[4] = local_528.data._M_elems[4];
    local_488.data._M_elems[5] = local_528.data._M_elems[5];
    local_488.data._M_elems[6] = local_528.data._M_elems[6];
    local_488.data._M_elems[7] = local_528.data._M_elems[7];
    local_488.data._M_elems[8] = local_528.data._M_elems[8];
    local_488.data._M_elems[9] = local_528.data._M_elems[9];
    local_488.data._M_elems[10] = local_528.data._M_elems[10];
    local_488.data._M_elems[0xb] = local_528.data._M_elems[0xb];
    local_488.data._M_elems[0xc] = local_528.data._M_elems[0xc];
    local_488.data._M_elems[0xd] = local_528.data._M_elems[0xd];
    local_488.data._M_elems._56_5_ = local_528.data._M_elems._56_5_;
    local_488.data._M_elems[0xf]._1_3_ = local_528.data._M_elems[0xf]._1_3_;
    local_488.exp = local_528.exp;
    local_488.neg = local_528.neg;
    local_488.fpclass = local_528.fpclass;
    local_488.prec_elem = local_528.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
              (&local_488,&local_78);
    if ((((local_4d8.fpclass != cpp_dec_float_NaN) && (local_488.fpclass != cpp_dec_float_NaN)) &&
        (iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4d8,&local_488), pDVar4 = &local_538, 0 < iVar3)) ||
       (pDVar4 = &local_538, local_530.info == 0)) goto LAB_00469e0a;
  }
  pDVar4 = &local_530;
LAB_00469e0a:
  return (SPxId)*pDVar4;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}